

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O3

void __thiscall sznet::Timer::restart(Timer *this,Timestamp now)

{
  double dVar1;
  int64_t iVar2;
  Timestamp local_30;
  Timestamp local_28;
  
  if (this->m_repeat == true) {
    dVar1 = this->m_interval;
    local_28.m_microSecondsSinceEpoch = now.m_microSecondsSinceEpoch;
    iVar2 = Timestamp::microSecondsSinceEpoch(&local_28);
    Timestamp::Timestamp(&local_30,(long)(dVar1 * 1000000.0) + iVar2);
  }
  else {
    local_30 = Timestamp::invalid();
  }
  (this->m_expiration).m_microSecondsSinceEpoch = local_30.m_microSecondsSinceEpoch;
  return;
}

Assistant:

void Timer::restart(Timestamp now)
{
	if (m_repeat)
	{
		// 可以重复，下一次到期时间
		m_expiration = addTime(now, m_interval);
	}
	else
	{
		// 不可以重复，无效的时间戳对象
		m_expiration = Timestamp::invalid();
	}
}